

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

const_iterator __thiscall libcellml::Model::ModelImpl::findUnits(ModelImpl *this,UnitsPtr *units)

{
  shared_ptr<libcellml::Units> *psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  _Var6;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<libcellml::Units>const>>
                    ((this->mUnits).
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->mUnits).
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,units);
  psVar1 = (this->mUnits).
           super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current != psVar1) {
    return (const_iterator)_Var4._M_current;
  }
  _Var4._M_current =
       (this->mUnits).
       super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar5 = (long)psVar1 - (long)_Var4._M_current >> 6;
  local_40 = peVar2;
  local_38 = this_00;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)&local_40,_Var4);
      _Var6._M_current = _Var4._M_current;
      if (bVar3) goto LAB_00234943;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)&local_40,_Var4._M_current + 1);
      _Var6._M_current = _Var4._M_current + 1;
      if (bVar3) goto LAB_00234943;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)&local_40,_Var4._M_current + 2);
      _Var6._M_current = _Var4._M_current + 2;
      if (bVar3) goto LAB_00234943;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)&local_40,_Var4._M_current + 3);
      _Var6._M_current = _Var4._M_current + 3;
      if (bVar3) goto LAB_00234943;
      _Var4._M_current = _Var4._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)psVar1 - (long)_Var4._M_current >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = psVar1;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
                  ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                                *)&local_40,_Var4), _Var6._M_current = _Var4._M_current, bVar3))
      goto LAB_00234943;
      _Var4._M_current = _Var4._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                          *)&local_40,_Var4);
    _Var6._M_current = _Var4._M_current;
    if (bVar3) goto LAB_00234943;
    _Var4._M_current = _Var4._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
          ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                        *)&local_40,_Var4);
  _Var6._M_current = psVar1;
  if (bVar3) {
    _Var6._M_current = _Var4._M_current;
  }
LAB_00234943:
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (const_iterator)_Var6._M_current;
}

Assistant:

std::vector<UnitsPtr>::const_iterator Model::ModelImpl::findUnits(const UnitsPtr &units) const
{
    auto result = std::find(mUnits.begin(), mUnits.end(), units);
    if (result != mUnits.end()) {
        return result;
    }
    return std::find_if(mUnits.begin(), mUnits.end(),
                        [=](const UnitsPtr &u) -> bool { return u->equals(units); });
}